

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int pk_get_ecpubkey(uchar **p,uchar *end,mbedtls_ecp_keypair *key)

{
  int iVar1;
  
  iVar1 = mbedtls_ecp_point_read_binary(&key->grp,&key->Q,*p,(long)end - (long)*p);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecp_check_pubkey(&key->grp,&key->Q);
  }
  *p = end;
  return iVar1;
}

Assistant:

static int pk_get_ecpubkey( unsigned char **p, const unsigned char *end,
                            mbedtls_ecp_keypair *key )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if( ( ret = mbedtls_ecp_point_read_binary( &key->grp, &key->Q,
                    (const unsigned char *) *p, end - *p ) ) == 0 )
    {
        ret = mbedtls_ecp_check_pubkey( &key->grp, &key->Q );
    }

    /*
     * We know mbedtls_ecp_point_read_binary consumed all bytes or failed
     */
    *p = (unsigned char *) end;

    return( ret );
}